

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall ArgTest_CharArg_Test::TestBody(ArgTest_CharArg_Test *this)

{
  MockSpec<test_result_(char)> *this_00;
  MockSpec<test_result_(wchar_t)> *pMVar1;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<char>_> visitor;
  
  testing::StrictMock<mock_visitor<char>_>::StrictMock(&visitor);
  testing::Matcher<char>::Matcher((Matcher<char> *)&arg,'a');
  this_00 = mock_visitor<char>::gmock_visit(&visitor.super_mock_visitor<char>,(Matcher<char> *)&arg)
  ;
  testing::internal::MockSpec<test_result_(char)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x158,"visitor","visit(\'a\')");
  testing::internal::MatcherBase<char>::~MatcherBase((MatcherBase<char> *)&arg);
  arg.type_ = char_type;
  arg.value_.field_0.long_long_value = 0x61;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<char>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&visitor,&arg);
  testing::StrictMock<mock_visitor<char>_>::~StrictMock(&visitor);
  testing::StrictMock<mock_visitor<wchar_t>_>::StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)&visitor);
  testing::Matcher<wchar_t>::Matcher((Matcher<wchar_t> *)&arg,L'a');
  pMVar1 = mock_visitor<wchar_t>::gmock_visit
                     ((mock_visitor<wchar_t> *)&visitor.super_mock_visitor<char>,
                      (Matcher<wchar_t> *)&arg);
  testing::internal::MockSpec<test_result_(wchar_t)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x159,"visitor","visit(L\'a\')");
  testing::internal::MatcherBase<wchar_t>::~MatcherBase((MatcherBase<wchar_t> *)&arg);
  arg.type_ = char_type;
  arg.value_.field_0.long_long_value = 0x61;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<wchar_t>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<wchar_t>_> *)&visitor,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)&arg);
  testing::StrictMock<mock_visitor<wchar_t>_>::~StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)&visitor);
  testing::StrictMock<mock_visitor<wchar_t>_>::StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)&visitor);
  testing::Matcher<wchar_t>::Matcher((Matcher<wchar_t> *)&arg,L'a');
  pMVar1 = mock_visitor<wchar_t>::gmock_visit
                     ((mock_visitor<wchar_t> *)&visitor.super_mock_visitor<char>,
                      (Matcher<wchar_t> *)&arg);
  testing::internal::MockSpec<test_result_(wchar_t)>::InternalExpectedAt
            (pMVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x15a,"visitor","visit(L\'a\')");
  testing::internal::MatcherBase<wchar_t>::~MatcherBase((MatcherBase<wchar_t> *)&arg);
  arg.type_ = char_type;
  arg.value_.field_0.long_long_value = 0x61;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<wchar_t>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<wchar_t>_> *)&visitor,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
              *)&arg);
  testing::StrictMock<mock_visitor<wchar_t>_>::~StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)&visitor);
  return;
}

Assistant:

TEST(ArgTest, CharArg) {
  CHECK_ARG_(char, 'a', 'a');
  CHECK_ARG_(wchar_t, L'a', 'a');
  CHECK_ARG_(wchar_t, L'a', L'a');
}